

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O1

RK_S32 mpp_hevc_decode_short_term_rps
                 (HEVCContext *s,ShortTermRPS *rps,HEVCSPS *sps,RK_S32 is_slice_header)

{
  RK_U8 RVar1;
  BitReadCtx_t *bitctx;
  uint uVar2;
  MPP_RET MVar3;
  RK_S32 RVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char cVar14;
  RK_U32 RVar15;
  ShortTermRPS *pSVar16;
  bool bVar17;
  RK_S32 _out;
  RK_U32 local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  long local_38;
  
  bitctx = &s->HEVClc->gb;
  pSVar16 = sps->st_rps;
  cVar14 = '\0';
  if ((pSVar16 != rps) && (sps->nb_st_rps != 0)) {
    MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_48);
    bitctx->ret = MVar3;
    RVar15 = 0;
    if (MVar3 == MPP_OK) {
      RVar15 = local_48;
    }
    cVar14 = (char)RVar15;
    if (MVar3 != MPP_OK) {
      return -0x3ec;
    }
  }
  if (cVar14 == '\0') {
    MVar3 = mpp_read_ue(bitctx,&local_48);
    bitctx->ret = MVar3;
    iVar7 = 4;
    if (MVar3 == MPP_OK) {
      rps->num_negative_pics = local_48;
      MVar3 = mpp_read_ue(bitctx,&local_48);
      RVar15 = local_48;
      bitctx->ret = MVar3;
      if (MVar3 == MPP_OK) {
        if ((rps->num_negative_pics < 0x10) && (local_48 < 0x10)) {
          iVar7 = 0;
          iVar5 = rps->num_negative_pics + local_48;
          rps->num_delta_pocs = iVar5;
          if (iVar5 != 0) {
            if (rps->num_negative_pics != 0) {
              uVar8 = 0;
              iVar5 = 0;
              do {
                MVar3 = mpp_read_ue(bitctx,&local_48);
                bitctx->ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_001a0d21;
                iVar5 = iVar5 + ~local_48;
                rps->delta_poc[uVar8] = iVar5;
                MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_48);
                bitctx->ret = MVar3;
                iVar7 = 4;
                if (MVar3 != MPP_OK) goto LAB_001a0d26;
                rps->used[uVar8] = (RK_U8)local_48;
                uVar8 = uVar8 + 1;
              } while (uVar8 < rps->num_negative_pics);
            }
            iVar7 = 0;
            if (RVar15 != 0) {
              iVar5 = 0;
              uVar6 = 0;
              do {
                MVar3 = mpp_read_ue(bitctx,&local_48);
                bitctx->ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_001a0d21;
                iVar5 = iVar5 + local_48 + 1;
                rps->delta_poc[rps->num_negative_pics + uVar6] = iVar5;
                MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_48);
                bitctx->ret = MVar3;
                iVar7 = 4;
                if (MVar3 != MPP_OK) break;
                rps->used[rps->num_negative_pics + uVar6] = (RK_U8)local_48;
                uVar6 = uVar6 + 1;
                iVar7 = 0;
              } while (RVar15 != uVar6);
            }
          }
        }
        else {
          _mpp_log_l(2,"H265PARSER_PS","Too many refs in a short term RPS.\n",(char *)0x0);
LAB_001a0d21:
          iVar7 = 1;
        }
      }
      else {
        iVar7 = (uint)(MVar3 != MPP_OK) << 2;
      }
    }
LAB_001a0d26:
    if (iVar7 != 0) {
      return -0x3ec;
    }
    return 0;
  }
  if (is_slice_header == 0) {
    pSVar16 = rps + -1;
  }
  else {
    MVar3 = mpp_read_ue(bitctx,&local_48);
    bitctx->ret = MVar3;
    bVar17 = MVar3 == MPP_OK;
    if (bVar17) {
      if (sps->nb_st_rps < local_48 + 1) {
        bVar17 = false;
        _mpp_log_l(2,"H265PARSER_PS","Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                   (char *)0x0);
      }
      else {
        pSVar16 = pSVar16 + (sps->nb_st_rps - (local_48 + 1));
        bVar17 = true;
      }
    }
    if (!bVar17) {
LAB_001a0be6:
      bVar17 = false;
      goto LAB_001a0be8;
    }
  }
  MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_48);
  bitctx->ret = MVar3;
  uVar6 = local_48 & 0xff;
  bVar17 = MVar3 == MPP_OK;
  if (bVar17) {
    MVar3 = mpp_read_ue(bitctx,&local_48);
    bitctx->ret = MVar3;
    bVar17 = MVar3 == MPP_OK;
    if (bVar17) {
      if (pSVar16->num_delta_pocs < 0) {
        local_40 = 0;
        uVar6 = 0;
      }
      else {
        local_3c = (local_48 + 1) * (uVar6 * -2 + 1);
        local_44 = 0;
        uVar6 = 0;
        local_40 = 0;
        lVar12 = 0;
        do {
          MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_48);
          RVar15 = local_48;
          bitctx->ret = MVar3;
          bVar17 = MVar3 == MPP_OK;
          if (bVar17) {
            lVar10 = (long)(int)local_40;
            rps->used[lVar10] = (RK_U8)local_48;
            uVar2 = local_44;
            if (local_48 == 0) {
              local_38 = lVar10;
              MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_48);
              bitctx->ret = MVar3;
              bVar17 = MVar3 == MPP_OK;
              lVar10 = local_38;
              uVar2 = local_48;
              if (!bVar17) {
                local_44 = local_44 & 0xff;
                goto LAB_001a0bc9;
              }
            }
            local_44 = uVar2;
            bVar17 = true;
            if ((RVar15 != 0) || ((char)local_44 != '\0')) {
              iVar7 = local_3c;
              if (lVar12 < pSVar16->num_delta_pocs) {
                iVar7 = pSVar16->delta_poc[lVar12] + local_3c;
              }
              rps->delta_poc[lVar10] = iVar7;
              uVar6 = uVar6 - (iVar7 >> 0x1f);
              local_40 = (int)lVar10 + 1;
            }
          }
LAB_001a0bc9:
          if (!bVar17) goto LAB_001a0be6;
          bVar17 = lVar12 < pSVar16->num_delta_pocs;
          lVar12 = lVar12 + 1;
        } while (bVar17);
      }
      rps->num_delta_pocs = local_40;
      rps->num_negative_pics = uVar6;
      if (1 < (int)local_40) {
        uVar8 = 1;
        uVar9 = 0;
        do {
          iVar7 = rps->delta_poc[uVar8];
          RVar1 = rps->used[uVar8];
          uVar11 = uVar9;
          do {
            uVar13 = uVar11 & 0xffffffff;
            if (iVar7 < rps->delta_poc[uVar13]) {
              rps->delta_poc[uVar11 + 1] = rps->delta_poc[uVar13];
              rps->used[uVar11 + 1] = rps->used[uVar13];
              rps->delta_poc[uVar13] = iVar7;
              rps->used[uVar13] = RVar1;
            }
            lVar12 = uVar11 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < lVar12);
          uVar8 = uVar8 + 1;
          uVar9 = uVar9 + 1;
        } while (uVar8 != local_40);
      }
      bVar17 = true;
      if ((1 < uVar6) && (1 < rps->num_negative_pics)) {
        uVar8 = 0;
        do {
          uVar6 = uVar6 - 1;
          RVar4 = rps->delta_poc[uVar8];
          RVar1 = rps->used[uVar8];
          rps->delta_poc[uVar8] = rps->delta_poc[(int)uVar6];
          rps->used[uVar8] = rps->used[(int)uVar6];
          rps->delta_poc[(int)uVar6] = RVar4;
          rps->used[(int)uVar6] = RVar1;
          uVar8 = uVar8 + 1;
        } while (uVar8 < rps->num_negative_pics >> 1);
      }
    }
  }
LAB_001a0be8:
  RVar4 = -0x3ec;
  if (bVar17) {
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

int mpp_hevc_decode_short_term_rps(HEVCContext *s, ShortTermRPS *rps,
                                   const HEVCSPS *sps, RK_S32 is_slice_header)
{
    HEVCLocalContext *lc = s->HEVClc;
    RK_U8 rps_predict = 0;
    RK_S32 delta_poc;
    RK_S32 k0 = 0;
    RK_S32 k  = 0;
    RK_S32 i;

    BitReadCtx_t *gb = &lc->gb;

    if (rps != sps->st_rps && sps->nb_st_rps)
        READ_ONEBIT(gb, &rps_predict);

    if (rps_predict) {
        const ShortTermRPS *rps_ridx;
        RK_S32 delta_rps, abs_delta_rps;
        RK_U8 use_delta_flag = 0;
        RK_U8 delta_rps_sign;

        if (is_slice_header) {
            RK_U32 delta_idx = 0;
            READ_UE(gb, &delta_idx);
            delta_idx = delta_idx + 1;
            if (delta_idx > sps->nb_st_rps) {
                mpp_err(
                    "Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                    delta_idx, sps->nb_st_rps);
                return  MPP_ERR_STREAM;
            }
            rps_ridx = &sps->st_rps[sps->nb_st_rps - delta_idx];
        } else
            rps_ridx = &sps->st_rps[rps - sps->st_rps - 1];

        READ_BITS(gb, 1, &delta_rps_sign);

        READ_UE(gb, &abs_delta_rps);

        abs_delta_rps = abs_delta_rps + 1;

        delta_rps      = (1 - (delta_rps_sign << 1)) * abs_delta_rps;
        for (i = 0; i <= rps_ridx->num_delta_pocs; i++) {
            RK_S32 used = 0;
            READ_ONEBIT(gb, &used);

            rps->used[k] = used;

            if (!used)
                READ_ONEBIT(gb, &use_delta_flag);

            if (used || use_delta_flag) {
                if (i < rps_ridx->num_delta_pocs)
                    delta_poc = delta_rps + rps_ridx->delta_poc[i];
                else
                    delta_poc = delta_rps;
                rps->delta_poc[k] = delta_poc;
                if (delta_poc < 0)
                    k0++;
                k++;
            }
        }

        rps->num_delta_pocs    = k;
        rps->num_negative_pics = k0;
        // sort in increasing order (smallest first)
        if (rps->num_delta_pocs != 0) {
            RK_S32 used, tmp;
            for (i = 1; i < rps->num_delta_pocs; i++) {
                delta_poc = rps->delta_poc[i];
                used      = rps->used[i];
                for (k = i - 1; k >= 0; k--) {
                    tmp = rps->delta_poc[k];
                    if (delta_poc < tmp) {
                        rps->delta_poc[k + 1] = tmp;
                        rps->used[k + 1]      = rps->used[k];
                        rps->delta_poc[k]     = delta_poc;
                        rps->used[k]          = used;
                    }
                }
            }
        }
        if ((rps->num_negative_pics >> 1) != 0) {
            RK_S32 used;
            k = rps->num_negative_pics - 1;
            // flip the negative values to largest first
            for (i = 0; (RK_U32)i < rps->num_negative_pics >> 1; i++) {
                delta_poc         = rps->delta_poc[i];
                used              = rps->used[i];
                rps->delta_poc[i] = rps->delta_poc[k];
                rps->used[i]      = rps->used[k];
                rps->delta_poc[k] = delta_poc;
                rps->used[k]      = used;
                k--;
            }
        }
    } else {
        RK_U32 prev, nb_positive_pics;

        READ_UE(gb, &rps->num_negative_pics);

        READ_UE(gb, &nb_positive_pics);

        if (rps->num_negative_pics >= MAX_REFS ||
            nb_positive_pics >= MAX_REFS) {
            mpp_err( "Too many refs in a short term RPS.\n");
            return  MPP_ERR_STREAM;
        }

        rps->num_delta_pocs = rps->num_negative_pics + nb_positive_pics;
        if (rps->num_delta_pocs) {
            prev = 0;
            for (i = 0; (RK_U32)i < rps->num_negative_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc += 1;
                prev -= delta_poc;
                rps->delta_poc[i] = prev;
                READ_ONEBIT(gb, &rps->used[i]);
            }
            prev = 0;
            for (i = 0; (RK_U32)i < nb_positive_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc = delta_poc + 1;
                prev += delta_poc;
                rps->delta_poc[rps->num_negative_pics + i] = prev;
                READ_ONEBIT(gb, &rps->used[rps->num_negative_pics + i]);
            }
        }
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}